

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_RepeatedSetOptionTest_Unknown_Test::TestBody
          (ComparisonTest_RepeatedSetOptionTest_Unknown_Test *this)

{
  UnknownFieldSet *pUVar1;
  char *message;
  AssertHelper AStack_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  (this->super_ComparisonTest).repeated_field_as_set_ = true;
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,1);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,3);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,1);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_30,this,(Message *)&(this->super_ComparisonTest).empty1_,
             (Message *)&(this->super_ComparisonTest).empty2_);
  testing::internal::CmpHelperEQ<char[74],std::__cxx11::string>
            (local_40,
             "\"modified: 245[0].248[0]: 0x00000001 -> 0x00000003\\n\" \"added: 245[1]: { ... }\\n\""
             ,"RunUn()",
             (char (*) [74])
             "modified: 245[0].248[0]: 0x00000001 -> 0x00000003\nadded: 245[1]: { ... }\n",&local_30
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd18,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, RepeatedSetOptionTest_Unknown) {
  // Currently, as_set option doesn't have affects on unknown field.
  // If needed, this feature will be added by request.
  repeated_field_as_set();
  unknown1_->AddGroup(245)->AddFixed32(248, 1);
  unknown2_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddGroup(245)->AddFixed32(248, 1);

  // We expect it behaves the same as normal comparison.
  EXPECT_EQ(
      "modified: 245[0].248[0]: 0x00000001 -> 0x00000003\n"
      "added: 245[1]: { ... }\n",
      RunUn());
}